

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O2

void __thiscall SocketLog::flush(SocketLog *this)

{
  _Elt_pointer pbVar1;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  int in_R8D;
  
  std::mutex::lock(&this->msgQueueMutex);
  __buf = extraout_RDX;
  while (pbVar1 = (this->msgQueue).c.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->msgQueue).c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != pbVar1) {
    send(this,(int)pbVar1,__buf,in_RCX,in_R8D);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&(this->msgQueue).c);
    __buf = extraout_RDX_00;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->msgQueueMutex);
  return;
}

Assistant:

void SocketLog::flush() {
    std::lock_guard<std::mutex> lock(msgQueueMutex);

    while (!msgQueue.empty()) {
        send(msgQueue.front());
        msgQueue.pop();
    }
}